

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageProcessingQCOMDecoration
          (ValidationState_t *_,int id,Decoration decor)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  Instruction *this;
  string local_220;
  DiagnosticStream local_200;
  
  this = ValidationState_t::FindDef(_,id);
  uVar2 = (this->inst_).opcode;
  if (uVar2 == 0x56) {
    uVar3 = Instruction::GetOperandAs<int>(this,2);
    this = ValidationState_t::FindDef(_,uVar3);
    uVar2 = (this->inst_).opcode;
  }
  if (uVar2 == 0x3d) {
    uVar3 = Instruction::GetOperandAs<int>(this,2);
    bVar1 = ValidationState_t::HasDecoration(_,uVar3,decor);
    if (bVar1) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,this);
    std::operator<<((ostream *)&local_200,"Missing decoration ");
    ValidationState_t::SpvDecorationString_abi_cxx11_(&local_220,_,decor);
    std::operator<<((ostream *)&local_200,(string *)&local_220);
    std::__cxx11::string::_M_dispose();
  }
  else {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,this);
    std::operator<<((ostream *)&local_200,"Expect to see OpLoad");
  }
  DiagnosticStream::~DiagnosticStream(&local_200);
  return local_200.error_;
}

Assistant:

spv_result_t ValidateImageProcessingQCOMDecoration(ValidationState_t& _, int id,
                                                   spv::Decoration decor) {
  const Instruction* si_inst = nullptr;
  const Instruction* ld_inst = _.FindDef(id);
  bool is_intf_obj = (ld_inst->opcode() == spv::Op::OpSampledImage);
  if (is_intf_obj == true) {
    si_inst = ld_inst;
    int t_idx = si_inst->GetOperandAs<int>(2);  // texture
    ld_inst = _.FindDef(t_idx);
  }
  if (ld_inst->opcode() != spv::Op::OpLoad) {
    return _.diag(SPV_ERROR_INVALID_DATA, ld_inst) << "Expect to see OpLoad";
  }
  int texture_id = ld_inst->GetOperandAs<int>(2);  // variable to load
  if (!_.HasDecoration(texture_id, decor)) {
    return _.diag(SPV_ERROR_INVALID_DATA, ld_inst)
           << "Missing decoration " << _.SpvDecorationString(decor);
  }

  return SPV_SUCCESS;
}